

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

DriveStrength slang::ast::getDriveStrengthVal(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if ((ushort)(kind - HighZ0Keyword) < 2) {
    local_4 = HighZ;
  }
  else if ((ushort)(kind - Pull0Keyword) < 2) {
    local_4 = Pull;
  }
  else if ((ushort)(kind - Strong0Keyword) < 2) {
    local_4 = Strong;
  }
  else if ((ushort)(kind - Supply0Keyword) < 2) {
    local_4 = Supply;
  }
  else {
    local_4 = Weak;
  }
  return local_4;
}

Assistant:

static DriveStrength getDriveStrengthVal(TokenKind kind) {
    switch (kind) {
        case TokenKind::Supply0Keyword:
        case TokenKind::Supply1Keyword:
            return DriveStrength::Supply;
        case TokenKind::Strong0Keyword:
        case TokenKind::Strong1Keyword:
            return DriveStrength::Strong;
        case TokenKind::Weak0Keyword:
        case TokenKind::Weak1Keyword:
            return DriveStrength::Weak;
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            return DriveStrength::Pull;
        case TokenKind::HighZ0Keyword:
        case TokenKind::HighZ1Keyword:
            return DriveStrength::HighZ;
        default:
            SLANG_UNREACHABLE;
    }
}